

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_icu::calendar_impl::get_timezone_abi_cxx11_
          (string *__return_storage_ptr__,calendar_impl *this)

{
  long lVar1;
  UnicodeString tz;
  icu_std_converter<char,_1> cvt;
  string local_a0;
  code *local_80;
  undefined2 local_78;
  undefined1 local_40 [48];
  
  local_80 = std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
  local_78 = 2;
  lVar1 = icu_70::Calendar::getTimeZone();
  icu_70::UnicodeString::operator=((UnicodeString *)&local_80,(UnicodeString *)(lVar1 + 8));
  std::__cxx11::string::string((string *)&local_a0,(string *)&this->encoding_);
  icu_std_converter<char,_1>::icu_std_converter
            ((icu_std_converter<char,_1> *)local_40,&local_a0,cvt_skip);
  std::__cxx11::string::~string((string *)&local_a0);
  icu_std_converter<char,1>::std_abi_cxx11_
            (__return_storage_ptr__,local_40,(UnicodeString *)&local_80);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string get_timezone() const 
        {
            icu::UnicodeString tz;
            calendar_->getTimeZone().getID(tz);
            icu_std_converter<char> cvt(encoding_);
            return cvt.std(tz);
        }